

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

bool __thiscall
Js::SourceTextModuleRecord::ResolveExport
          (SourceTextModuleRecord *this,PropertyId exportName,ResolveSet *resolveSet,
          ModuleNameRecord **exportRecord)

{
  int *key;
  ModuleRecordBase *pMVar1;
  IdentPtr pIVar2;
  IdentPtr pid;
  code *pcVar3;
  ModuleNameRecord **ppMVar4;
  undefined1 auVar5 [8];
  bool bVar6;
  uint uVar7;
  Type localName;
  int iVar8;
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar9;
  undefined4 *puVar10;
  Type *other;
  Type *pTVar11;
  SourceTextModuleRecord *pSVar12;
  SourceTextModuleRecord *pSVar13;
  PCWSTR specifier;
  ScriptContext *scriptContext;
  ArenaAllocator *alloc;
  undefined1 local_68 [8];
  ModuleNameRecord *importRecord;
  ModuleRecordBase *local_58;
  ModuleNameRecord **local_50;
  undefined1 local_48 [8];
  Iterator iter;
  PropertyId exportName_local;
  
  alloc = &((this->scriptContext).ptr)->generalAllocator;
  pBVar9 = (this->resolvedExportMap).ptr;
  iter.current._4_4_ = exportName;
  if (pBVar9 == (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)0x0) {
    pBVar9 = (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)new<Memory::ArenaAllocator>(0x38,alloc,0x35916e);
    pBVar9->buckets = (Type)0x0;
    pBVar9->entries = (Type)0x0;
    pBVar9->alloc = alloc;
    pBVar9->size = 0;
    pBVar9->bucketCount = 0;
    pBVar9->count = 0;
    pBVar9->freeCount = 0;
    pBVar9->modFunctionIndex = 0x4b;
    pBVar9->stats = (Type)0x0;
    Memory::
    WriteBarrierPtr<JsUtil::BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::WriteBarrierSet(&this->resolvedExportMap,pBVar9);
    pBVar9 = (this->resolvedExportMap).ptr;
  }
  bVar6 = JsUtil::
          BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<int>(pBVar9,(int *)((long)&iter.current + 4),exportRecord);
  if (bVar6) {
    return true;
  }
  if (resolveSet == (ResolveSet *)0x0) {
    resolveSet = (ResolveSet *)new<Memory::ArenaAllocator>(0x18,alloc,0x35916e);
    (((SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
     &((ModuleRecordBase *)resolveSet)->super_FinalizableObject)->
    super_SListNodeBase<Memory::ArenaAllocator>).next = (Type)resolveSet;
    ((RealCount *)&((ModuleRecordBase *)resolveSet)->magicNumber)->count = 0;
    (((ModuleRecordBase *)resolveSet)->namespaceObject).ptr = (ModuleNamespace *)alloc;
  }
  *exportRecord = (ModuleNameRecord *)0x0;
  local_50 = exportRecord;
  local_48 = (undefined1  [8])resolveSet;
  iter.list = &resolveSet->super_SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount>;
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_58 = (ModuleRecordBase *)resolveSet;
  while( true ) {
    if ((ModuleRecordBase *)resolveSet == (ModuleRecordBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) goto LAB_009e8eb4;
      *puVar10 = 0;
      resolveSet = (ResolveSet *)iter.list;
    }
    uVar7 = iter.current._4_4_;
    pMVar1 = (ModuleRecordBase *)
             (((SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
              &((ModuleRecordBase *)resolveSet)->super_FinalizableObject)->
             super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])pMVar1 == local_48) break;
    iter.list = (SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)pMVar1;
    other = SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                      ((Iterator *)local_48);
    ModuleNameRecord::ModuleNameRecord((ModuleNameRecord *)local_68,other);
    resolveSet = (ResolveSet *)iter.list;
    if ((local_68 == (undefined1  [8])this) && ((uint)importRecord == iter.current._4_4_)) {
      *local_50 = (ModuleNameRecord *)0x0;
      return true;
    }
  }
  Memory::WriteBarrierPtr<Js::ModuleRecordBase>::WriteBarrierSet
            ((WriteBarrierPtr<Js::ModuleRecordBase> *)local_48,&this->super_ModuleRecordBase);
  iter.list = (SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
              CONCAT44(iter.list._4_4_,uVar7);
  SList<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount>::Prepend
            ((SList<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)local_58,
             (ModuleNameRecord *)local_48);
  local_48 = (undefined1  [8])(this->localExportRecordList).ptr;
  iter.list = (SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)local_48;
  if (local_48 != (undefined1  [8])0x0) {
    do {
      if (iter.list == (SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar6) goto LAB_009e8eb4;
        *puVar10 = 0;
      }
      iter.list = (SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
                  ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])iter.list == local_48) goto LAB_009e8c1e;
      pTVar11 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
                Data((Iterator *)local_48);
      pIVar2 = pTVar11->localName;
      uVar7 = EnsurePropertyIdForIdentifier(this,pTVar11->exportName);
    } while (uVar7 != iter.current._4_4_);
    localName = EnsurePropertyIdForIdentifier(this,pIVar2);
    if (localName != 0xffffffff) {
      local_68 = (undefined1  [8])0x0;
      pSVar12 = this;
      if (((this->importRecordList).ptr !=
           (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
         (bVar6 = ResolveImport(this,localName,(ModuleNameRecord **)local_68),
         local_68 != (undefined1  [8])0x0 && bVar6)) {
        localName = *(Type *)((long)local_68 + 8);
        pSVar12 = (SourceTextModuleRecord *)
                  (((FinalizableObject *)local_68)->super_IRecyclerVisitedObject).
                  _vptr_IRecyclerVisitedObject;
      }
      ppMVar4 = local_50;
      pBVar9 = (this->resolvedExportMap).ptr;
      Memory::WriteBarrierPtr<Js::ModuleRecordBase>::WriteBarrierSet
                ((WriteBarrierPtr<Js::ModuleRecordBase> *)local_48,&pSVar12->super_ModuleRecordBase)
      ;
      iter.list = (SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
                  CONCAT44(iter.list._4_4_,localName);
      key = (int *)((long)&iter.current + 4);
      JsUtil::
      BaseDictionary<int,Js::ModuleNameRecord,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<int,Js::ModuleNameRecord,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<int,Js::ModuleNameRecord,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)pBVar9,key,(ModuleNameRecord *)local_48);
      JsUtil::
      BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::TryGetReference<int>((this->resolvedExportMap).ptr,key,ppMVar4);
      return true;
    }
  }
LAB_009e8c1e:
  local_48 = (undefined1  [8])(this->indirectExportRecordList).ptr;
  iter.list = (SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)local_48;
  if (local_48 == (undefined1  [8])0x0) {
LAB_009e8d37:
    if (iter.current._4_4_ == 0x6e) {
      return false;
    }
    local_48 = (undefined1  [8])(this->starExportRecordList).ptr;
    if (local_48 != (undefined1  [8])0x0) {
      auVar5 = (undefined1  [8])(SourceTextModuleRecord *)0x0;
      iter.list = (SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)local_48;
      do {
        pSVar12 = (SourceTextModuleRecord *)auVar5;
        if (iter.list == (SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)0x0)
        {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) {
LAB_009e8eb4:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar10 = 0;
        }
        iter.list = (SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
                    ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])iter.list == local_48) goto LAB_009e8e9a;
        pTVar11 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)local_48);
        local_68 = (undefined1  [8])0x0;
        specifier = (PCWSTR)&pTVar11->moduleRequest->field_0x22;
        pSVar13 = GetChildModuleRecord(this,specifier);
        if (pSVar13 == (SourceTextModuleRecord *)0x0) {
          ReleaseParserResourcesForHierarchy(this);
          scriptContext = (this->scriptContext).ptr;
LAB_009e8ee9:
          JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5e9f2,specifier);
        }
        if ((pSVar13->errorObject).ptr != (void *)0x0) {
          ReleaseParserResourcesForHierarchy(this);
          JavascriptExceptionOperators::Throw((pSVar13->errorObject).ptr,(this->scriptContext).ptr);
        }
        iVar8 = (*(pSVar13->super_ModuleRecordBase).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])
                          (pSVar13,(ulong)iter.current._4_4_,local_58);
        if ((char)iVar8 == '\0') {
          return false;
        }
        auVar5 = (undefined1  [8])pSVar12;
      } while ((local_68 == (undefined1  [8])0x0) ||
              (auVar5 = local_68, pSVar12 == (SourceTextModuleRecord *)0x0));
      if (*(Type *)((long)local_68 + 8) != (pSVar12->super_ModuleRecordBase).magicNumber) {
        return false;
      }
      if ((ModuleRecordBase *)
          (((ModuleRecordBase *)local_68)->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject !=
          (ModuleRecordBase *)
          (pSVar12->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject) {
        return false;
      }
LAB_009e8e9a:
      *local_50 = (ModuleNameRecord *)pSVar12;
    }
  }
  else {
    do {
      do {
        if (iter.list == (SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)0x0)
        {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) goto LAB_009e8eb4;
          *puVar10 = 0;
        }
        iter.list = (SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
                    ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])iter.list == local_48) {
          if (*local_50 != (ModuleNameRecord *)0x0) {
            return true;
          }
          goto LAB_009e8d37;
        }
        pTVar11 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)local_48);
        pIVar2 = pTVar11->moduleRequest;
        pid = pTVar11->importName;
        uVar7 = EnsurePropertyIdForIdentifier(this,pTVar11->exportName);
      } while (iter.current._4_4_ != uVar7);
      uVar7 = EnsurePropertyIdForIdentifier(this,pid);
      specifier = (PCWSTR)&pIVar2->field_0x22;
      pSVar12 = GetChildModuleRecord(this,specifier);
      ppMVar4 = local_50;
      if (pSVar12 == (SourceTextModuleRecord *)0x0) {
        ReleaseParserResourcesForHierarchy(this);
        scriptContext = (this->scriptContext).ptr;
        goto LAB_009e8ee9;
      }
      if (pid->m_propertyId == 0x70) {
        *local_50 = &pSVar12->namespaceRecord;
        return true;
      }
      iVar8 = (*(pSVar12->super_ModuleRecordBase).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])
                        (pSVar12,(ulong)uVar7,local_58);
      if ((char)iVar8 == '\0') {
        return false;
      }
    } while (*ppMVar4 == (ModuleNameRecord *)0x0);
  }
  return true;
}

Assistant:

bool SourceTextModuleRecord::ResolveExport(PropertyId exportName, ResolveSet* resolveSet, ModuleNameRecord** exportRecord)
    {
        ArenaAllocator* allocator = scriptContext->GeneralAllocator();
        if (resolvedExportMap == nullptr)
        {
            resolvedExportMap = Anew(allocator, ResolvedExportMap, allocator);
        }
        if (resolvedExportMap->TryGetReference(exportName, exportRecord))
        {
            return true;
        }
        // TODO: use per-call/loop allocator?
        if (resolveSet == nullptr)
        {
            resolveSet = Anew(allocator, ResolveSet, allocator);
        }

        *exportRecord = nullptr;
        bool hasCircularRef = false;
        resolveSet->MapUntil([&](ModuleNameRecord moduleNameRecord) {
            if (moduleNameRecord.module == this && moduleNameRecord.bindingName == exportName)
            {
                *exportRecord = nullptr;
                hasCircularRef = true;
                return true;
            }
            return false;
        });
        if (hasCircularRef)
        {
            Assert(*exportRecord == nullptr);
            return true;
        }
        resolveSet->Prepend(ModuleNameRecord(this, exportName));

        if (localExportRecordList != nullptr)
        {
            PropertyId localNameId = Js::Constants::NoProperty;
            localExportRecordList->MapUntil([&](ModuleImportOrExportEntry exportEntry) {
                PropertyId exportNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                if (exportNameId == exportName)
                {
                    localNameId = EnsurePropertyIdForIdentifier(exportEntry.localName);
                    return true;
                }
                return false;
            });
            if (localNameId != Js::Constants::NoProperty)
            {
                // Check to see if we are exporting something we imported from another module without using a re-export.
                // ex: import { foo } from 'module'; export { foo };
                ModuleRecordBase* sourceModule = this;
                ModuleNameRecord* importRecord = nullptr;
                if (this->importRecordList != nullptr
                    && this->ResolveImport(localNameId, &importRecord)
                    && importRecord != nullptr)
                {
                    sourceModule = importRecord->module;
                    localNameId = importRecord->bindingName;
                }
                resolvedExportMap->AddNew(exportName, { sourceModule, localNameId });
                // return the address from Map buffer.
                resolvedExportMap->TryGetReference(exportName, exportRecord);
                return true;
            }
        }

        if (indirectExportRecordList != nullptr)
        {
            bool isAmbiguous = false;
            indirectExportRecordList->MapUntil([&](ModuleImportOrExportEntry exportEntry) {
                PropertyId reexportNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                if (exportName != reexportNameId)
                {
                    return false;
                }

                PropertyId importNameId = EnsurePropertyIdForIdentifier(exportEntry.importName);
                SourceTextModuleRecord* childModuleRecord = GetChildModuleRecord(exportEntry.moduleRequest->Psz());
                if (childModuleRecord == nullptr)
                {
                    this->ReleaseParserResourcesForHierarchy();
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_CannotResolveModule, exportEntry.moduleRequest->Psz());
                }

                if (exportEntry.importName->GetPropertyId() == PropertyIds::star_)
                {
                    // export * as someName from "foo"
                    *exportRecord = childModuleRecord->GetNamespaceNameRecord();
                    return true;
                }

                isAmbiguous = !childModuleRecord->ResolveExport(importNameId, resolveSet, exportRecord);
                if (isAmbiguous)
                {
                    // ambiguous; don't need to search further
                    return true;
                }

                // found a resolution. done;
                if (*exportRecord != nullptr)
                {
                    return true;
                }
                return false;
            });
            if (isAmbiguous)
            {
                return false;
            }
            if (*exportRecord != nullptr)
            {
                return true;
            }
        }

        if (exportName == PropertyIds::default_)
        {
            return false;
        }

        bool ambiguousResolution = false;
        if (this->starExportRecordList != nullptr)
        {
            ModuleNameRecord* starResolution = nullptr;
            starExportRecordList->MapUntil([&](ModuleImportOrExportEntry starExportEntry) {
                ModuleNameRecord* currentResolution = nullptr;
                SourceTextModuleRecord* childModule = GetChildModuleRecord(starExportEntry.moduleRequest->Psz());
                if (childModule == nullptr)
                {
                    this->ReleaseParserResourcesForHierarchy();
                    JavascriptError::ThrowReferenceError(GetScriptContext(), JSERR_CannotResolveModule, starExportEntry.moduleRequest->Psz());
                }
                if (childModule->errorObject != nullptr)
                {
                    this->ReleaseParserResourcesForHierarchy();
                    JavascriptExceptionOperators::Throw(childModule->errorObject, GetScriptContext());
                }

                // if ambiguous, return "ambiguous"
                if (!childModule->ResolveExport(exportName, resolveSet, &currentResolution))
                {
                    ambiguousResolution = true;
                    return true;
                }
                if (currentResolution != nullptr)
                {
                    if (starResolution == nullptr)
                    {
                        starResolution = currentResolution;
                    }
                    else
                    {
                        if (currentResolution->bindingName != starResolution->bindingName ||
                            currentResolution->module != starResolution->module)
                        {
                            ambiguousResolution = true;
                        }
                        return true;
                    }
                }
                return false;
            });
            if (!ambiguousResolution)
            {
                *exportRecord = starResolution;
            }
        }
        return !ambiguousResolution;
    }